

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

void re_reset(re_context *ctx)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = ctx->next_state;
  if (0 < iVar1) {
    lVar2 = 0x10;
    lVar3 = 0;
    do {
      __ptr = *(void **)(&ctx->tuple_arr->ch + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)(&ctx->tuple_arr->ch + lVar2) = 0;
        iVar1 = ctx->next_state;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < iVar1);
  }
  ctx->next_state = 0;
  ctx->cur_group = 0;
  return;
}

Assistant:

static void re_reset(re_context *ctx)
{
    int i;
    
    /* delete any range tables we've allocated */
    for (i = 0 ; i < ctx->next_state ; ++i)
    {
        if (ctx->tuple_arr[i].char_range != 0)
        {
            mchfre(ctx->tuple_arr[i].char_range);
            ctx->tuple_arr[i].char_range = 0;
        }
    }

    /* clear states */
    ctx->next_state = RE_STATE_FIRST_VALID;

    /* clear groups */
    ctx->cur_group = 0;
}